

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O1

void cdef_copy_rect8_16bit_to_16bit_sse4_1
               (uint16_t *dst,int dstride,uint16_t *src,int sstride,int width,int height)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 (*pauVar3) [16];
  undefined1 in_XMM0 [16];
  
  if (0 < height) {
    uVar1 = 0;
    do {
      uVar2 = 0;
      if (0 < (int)(width & 0xfffffff8U)) {
        uVar2 = 0;
        pauVar3 = (undefined1 (*) [16])src;
        do {
          in_XMM0 = lddqu(in_XMM0,*pauVar3);
          *(undefined1 (*) [16])(dst + uVar2) = in_XMM0;
          uVar2 = uVar2 + 8;
          pauVar3 = pauVar3 + 1;
        } while ((long)uVar2 < (long)(int)(width & 0xfffffff8U));
      }
      if ((int)uVar2 < width) {
        uVar2 = uVar2 & 0xffffffff;
        do {
          dst[uVar2] = *(uint16_t *)(*(undefined1 (*) [16])src + uVar2 * 2);
          uVar2 = uVar2 + 1;
        } while ((uint)width != uVar2);
      }
      uVar1 = uVar1 + 1;
      dst = dst + dstride;
      src = (uint16_t *)(*(undefined1 (*) [16])src + (long)sstride * 2);
    } while (uVar1 != (uint)height);
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_copy_rect8_16bit_to_16bit)(uint16_t *dst, int dstride,
                                               const uint16_t *src, int sstride,
                                               int width, int height) {
  int i, j;
  for (i = 0; i < height; i++) {
    for (j = 0; j < (width & ~0x7); j += 8) {
      v128 row = v128_load_unaligned(&src[i * sstride + j]);
      v128_store_unaligned(&dst[i * dstride + j], row);
    }
    for (; j < width; j++) {
      dst[i * dstride + j] = src[i * sstride + j];
    }
  }
}